

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

void __thiscall clinet::on_package(clinet *this,int netid,char *data,int len)

{
  ulong uVar1;
  char *pcVar2;
  char *__format;
  action_req req_1;
  join_req req;
  undefined8 local_68;
  undefined4 local_5c;
  undefined4 *local_58;
  undefined4 local_50;
  undefined4 *local_48;
  undefined4 local_40;
  
  switch(*(uint *)data) {
  case 2:
    if (*(int *)(data + 4) != 0) {
      __assert_fail("rsp->result == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/sample/client.cpp"
                    ,0x2e,"virtual void clinet::on_package(int, char *, int)");
    }
    this->userid_ = *(int *)(data + 8);
    printf(anon_var_dwarf_149);
    local_5c = 0;
    printf(anon_var_dwarf_15f);
    __isoc99_scanf("%d",&local_5c);
    local_68 = CONCAT44(local_68._4_4_,3);
    local_40 = 4;
    local_58 = (undefined4 *)&local_68;
    local_48 = &local_5c;
LAB_0010485f:
    local_50 = 4;
    (*this->network_->_vptr_inetwork[4])(this->network_,(ulong)(uint)this->netid_,&local_58,2);
    return;
  default:
    printf(anon_var_dwarf_229,(ulong)*(uint *)data,data,&switchD_001047f4::switchdataD_00107004);
    return;
  case 4:
    if (*(int *)(data + 4) != 0) {
      __assert_fail("rsp->result == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/sample/client.cpp"
                    ,0x3c,"virtual void clinet::on_package(int, char *, int)");
    }
    pcVar2 = &DAT_001072cf;
    break;
  case 5:
    uVar1 = (ulong)*(uint *)(data + 4);
    pcVar2 = data + 8;
    __format = anon_var_dwarf_186;
    goto LAB_00104903;
  case 6:
    uVar1 = (ulong)*(uint *)(data + 4);
    pcVar2 = data + 8;
    __format = anon_var_dwarf_19c;
LAB_00104903:
    printf(__format,uVar1,pcVar2);
    return;
  case 8:
    if (*(int *)(data + 4) == 0) {
      return;
    }
    __assert_fail("rsp->result == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/sample/client.cpp"
                  ,0x4f,"virtual void clinet::on_package(int, char *, int)");
  case 9:
    printf(anon_var_dwarf_1a6,(ulong)*(uint *)(data + 4),data + 8,(ulong)*(uint *)(data + 0x28),
           (ulong)*(uint *)(data + 0x2c));
    return;
  case 10:
    if (*(int *)(data + 8) == 3) {
      pcVar2 = &DAT_0010729d;
    }
    else {
      if (*(int *)(data + 8) != 0) {
        draw_chesses(data + 0xc);
        if (*(int *)(data + 8) == 1) {
          uVar1 = (ulong)*(uint *)(data + 0x10c);
          if (this->userid_ == *(uint *)(data + 0x10c)) {
            local_68 = 0;
            while( true ) {
              printf(anon_var_dwarf_1f6);
              __isoc99_scanf("%d,%d",&local_68,(long)&local_68 + 4);
              if ((0xfffffff0 < local_68._4_4_ - 0x10 && 0xfffffff0 < (int)local_68 - 0x10U) &&
                 (data[(local_68 & 0xffffffff) * 0xf + (ulong)local_68._4_4_ + -4] == '\0')) break;
              puts(&DAT_00107278);
            }
            local_5c = 7;
            local_40 = 8;
            local_58 = &local_5c;
            local_48 = (undefined4 *)&local_68;
            goto LAB_0010485f;
          }
          pcVar2 = data + 0x110;
          __format = anon_var_dwarf_1e0;
        }
        else {
          if (*(int *)(data + 8) != 2) {
            return;
          }
          uVar1 = (ulong)*(uint *)(data + 0x10c);
          pcVar2 = data + 0x110;
          __format = anon_var_dwarf_1d6;
        }
        goto LAB_00104903;
      }
      pcVar2 = &DAT_001072bc;
    }
  }
  puts(pcVar2);
  return;
}

Assistant:

void on_package(int netid, char* data, int len) override
    {
        message* _msg = (message*)data;
        switch (_msg->msgid)
        {
        case MSG_LOGIN_RSP:
        {
            login_rsp* rsp = (login_rsp*)_msg->body;
            assert(rsp->result == 0);
            
            userid_ = rsp->userid;
            printf("登录游戏成功，你的ID为%d\n", userid_);
            
            join_req req = { 0 };
            printf("请输入你要加入的房间id：");
            scanf("%d", &req.gameid);
            send_message(MSG_JOIN_REQ, &req, sizeof(req));
            break;
        }
        case MSG_JOIN_RSP:
        {
            join_rsp* rsp = (join_rsp*)_msg->body;
            assert(rsp->result == 0);
            printf("加入房间成功\n");
            break;
        }
        case MSG_JOIN_NTF:
        {
            join_ntf* ntf = (join_ntf*)_msg->body;
            printf("玩家[%d]-%s 加入房间\n", ntf->userid, ntf->name);
            break;
        }
        case MSG_QUIT_NTF:
        {
            quit_ntf* ntf = (quit_ntf*)_msg->body;
            printf("玩家[%d]-%s 退出房间\n", ntf->userid, ntf->name);
            break;
        }
        case MSG_ACTION_RSP:
        {
            action_rsp* rsp = (action_rsp*)_msg->body;
            assert(rsp->result == 0);
            break;
        }
        case MSG_ACTION_NTF:
        {
            action_ntf* ntf = (action_ntf*)_msg->body;
            printf("玩家[%d]-%s 下了(%d,%d)\n", ntf->userid, ntf->name, ntf->row, ntf->col);
            break;
        }
        case MSG_STATUS_NTF:
        {
            status_ntf* ntf = (status_ntf*)_msg->body;
            if (ntf->state == STATE_WAITING) {
                printf("等待对手加入\n");
                return;
            }

            if (ntf->state == STATE_ABORTED) {
                printf("有棋手退出，游戏中止\n");
                return;
            }

            draw_chesses(ntf->chesses);
            if (ntf->state == STATE_FINISH) {
                printf("游戏结束，玩家[%d]-%s胜利\n", ntf->userid, ntf->name);
                return;
            }

            if (ntf->state == STATE_PLAYING) {
                if (userid_ != ntf->userid) {
                    printf("等待玩家[%d]-%s下棋\n", ntf->userid, ntf->name);
                    return;
                }
                
                action_req req = { 0 };
                while (true)
                {
                    printf("轮到你下棋，请输入坐标(x,y)：");
                    scanf("%d,%d", &req.row, &req.col);
                    if (check_valid(ntf->chesses, req.row, req.col)) {
                        break;
                    }
                    printf("你的输入无效，请重新输入\n");
                }
                send_message(MSG_ACTION_REQ, &req, sizeof(req));
            }
            
            break;
        }
        default:
        {
            printf("未知的消息id(%d)\n", _msg->msgid);
            break;
        }
        }
    }